

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O2

void TPZVTKGeoMesh::SetMaterialVTK(TPZGeoEl *gel,int mat)

{
  TPZGeoMesh *pTVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int64_t nelem;
  TPZGeoNode *this;
  TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *this_00;
  TPZGeoEl *gel_00;
  ulong uVar6;
  int iVar7;
  TPZVec<long> Topol;
  TPZVec<double> NodeCoord;
  
  gel->fMatId = mat;
  uVar2 = (**(code **)(*(long *)gel + 0x90))();
  uVar6 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    TPZVec<double>::TPZVec(&NodeCoord,3);
    TPZVec<long>::TPZVec(&Topol,1);
    lVar5 = (**(code **)(*(long *)gel + 0xa8))(gel,uVar6 & 0xffffffff);
    *Topol.fStore = lVar5;
    pTVar1 = gel->fMesh;
    nelem = (**(code **)(*(long *)gel + 0xa8))(gel,uVar6 & 0xffffffff);
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(pTVar1->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
    TPZGeoNode::GetCoordinates(this,&NodeCoord);
    this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *)operator_new(0x90);
    TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern(this_00,0,&Topol,mat,gel->fMesh);
    TPZVec<long>::~TPZVec(&Topol);
    TPZVec<double>::~TPZVec(&NodeCoord);
  }
  iVar3 = (**(code **)(*(long *)gel + 0x1d0))(gel);
  if (iVar3 != 0) {
    iVar3 = (**(code **)(*(long *)gel + 0x148))(gel);
    iVar7 = 0;
    if (iVar3 < 1) {
      iVar3 = iVar7;
    }
    for (; iVar3 != iVar7; iVar7 = iVar7 + 1) {
      gel_00 = (TPZGeoEl *)(**(code **)(*(long *)gel + 0x1f8))(gel,iVar7);
      SetMaterialVTK(gel_00,mat);
    }
  }
  return;
}

Assistant:

void TPZVTKGeoMesh::SetMaterialVTK(TPZGeoEl * gel, int mat) {
    gel->SetMaterialId(mat);

    int64_t nnodes = gel->NNodes();
    for (int64_t nd = 0; nd < nnodes; nd++) {
        TPZVec<REAL> NodeCoord(3);
        TPZVec<int64_t> Topol(1);

        int64_t elIndex = 0;

        Topol[0] = gel->NodeIndex(nd);

        gel->Mesh()->NodeVec()[gel->NodeIndex(nd)].GetCoordinates(NodeCoord);
        new TPZGeoElRefPattern< pzgeom::TPZGeoPoint > (elIndex, Topol, mat, *(gel->Mesh()));
    }

    if (gel->HasSubElement()) {
        int nSons = gel->NSubElements();
        for (int s = 0; s < nSons; s++) {
            TPZGeoEl * son = gel->SubElement(s);
            SetMaterialVTK(son, mat);
        }
    }
}